

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebraReasoning.cpp
# Opt level: O2

Clause * Inferences::removeLit(Clause *c,uint i,Inference *inf)

{
  Value VVar1;
  Clause *pCVar2;
  StlIter __begin1;
  RStack<Literal_*> resLits;
  StlIter local_78;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_68;
  RangeIterator<unsigned_int> local_58;
  Inference local_48;
  
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_68);
  local_58._to = *(uint *)&c->field_0x38 & 0xfffff;
  local_58._next = 0;
  local_58._from = 0;
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::StlIter
            (&local_78,(IterTraits<Lib::RangeIterator<unsigned_int>_> *)&local_58);
  while ((local_78._cur.super_OptionBase<unsigned_int>._isSome & 1U) != 0) {
    if (local_78._cur.super_OptionBase<unsigned_int>._elem._elem.init != (Value)i) {
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)
                 local_68._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                 c->_literals[(int)local_78._cur.super_OptionBase<unsigned_int>._elem._elem]);
    }
    VVar1.init = *(uint *)local_78._iter.
                          super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                          super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>.
                          _elem;
    local_78._cur.super_OptionBase<unsigned_int>._isSome =
         VVar1.init <
         *(uint *)((long)local_78._iter.
                         super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>.
                         super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>.
                         _elem + 8);
    if (local_78._cur.super_OptionBase<unsigned_int>._isSome) {
      *(uint *)local_78._iter.super_OptionBase<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_&>
               .super_OptionBaseRef<Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>_*>._elem =
           VVar1.init + 1;
      local_78._cur.super_OptionBase<unsigned_int>._elem._elem = (Value)(Value)VVar1.init;
    }
  }
  local_48._0_8_ = *(undefined8 *)inf;
  local_48._8_4_ = *(undefined4 *)&inf->field_0x8;
  local_48._age = inf->_age;
  local_48._splits = inf->_splits;
  local_48._ptr1 = inf->_ptr1;
  local_48._ptr2 = inf->_ptr2;
  local_48.th_ancestors = inf->th_ancestors;
  local_48.all_ancestors = inf->all_ancestors;
  pCVar2 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      local_68._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_48);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_68);
  return pCVar2;
}

Assistant:

Clause* removeLit(Clause *c, unsigned i, const Inference& inf)
  {
    ASS_GE(i, 0);
    ASS_L(i, c->length());

    RStack<Literal*> resLits;
    for (auto j : range(0, c->size())) {
      if (j != i) {
        resLits->push((*c)[j]);
      }
    }

    return Clause::fromStack(*resLits,inf);
  }